

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O0

Matrix33 *
AML::eulerAngles2DCM_ZXZ(Matrix33 *__return_storage_ptr__,double phi,double theta,double psi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_98;
  double data [3] [3];
  double sinPsi;
  double cosPsi;
  double sinTheta;
  double cosTheta;
  double sinPhi;
  double cosPhi;
  double psi_local;
  double theta_local;
  double phi_local;
  
  dVar1 = cos(phi);
  dVar2 = sin(phi);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = cos(psi);
  data[2][2] = sin(psi);
  local_98 = dVar1 * dVar5 + -(dVar2 * dVar3 * data[2][2]);
  data[0][0] = dVar1 * data[2][2] + dVar2 * dVar3 * dVar5;
  data[0][1] = dVar2 * dVar4;
  data[0][2] = -dVar2 * dVar5 + -(dVar1 * dVar3 * data[2][2]);
  data[1][0] = -dVar2 * data[2][2] + dVar1 * dVar3 * dVar5;
  data[1][1] = dVar1 * dVar4;
  data[1][2] = dVar4 * data[2][2];
  data[2][0] = -dVar4 * dVar5;
  data[2][1] = dVar3;
  Matrix33::Matrix33(__return_storage_ptr__,(double (*) [3])&local_98);
  return __return_storage_ptr__;
}

Assistant:

Matrix33 eulerAngles2DCM_ZXZ(double phi, double theta, double psi)
    {
        const double cosPhi = cos(phi);
        const double sinPhi = sin(phi);
        const double cosTheta = cos(theta);
        const double sinTheta = sin(theta);
        const double cosPsi = cos(psi);
        const double sinPsi = sin(psi);

        double data[3][3];
        data[0][0] = cosPhi * cosPsi - sinPhi * cosTheta * sinPsi;
        data[0][1] = cosPhi * sinPsi + sinPhi * cosTheta * cosPsi;
        data[0][2] = sinPhi * sinTheta;
        data[1][0] = -sinPhi * cosPsi - cosPhi * cosTheta * sinPsi;
        data[1][1] = -sinPhi * sinPsi + cosPhi * cosTheta * cosPsi;
        data[1][2] = cosPhi * sinTheta;
        data[2][0] = sinTheta * sinPsi;
        data[2][1] = -sinTheta * cosPsi;
        data[2][2] = cosTheta;
        return Matrix33(data);
    }